

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void set_tpl_stats_block_size(uint8_t *block_mis_log2,uint8_t *tpl_bsize_1d)

{
  uint8_t *tpl_bsize_1d_local;
  uint8_t *block_mis_log2_local;
  
  *block_mis_log2 = '\x02';
  *tpl_bsize_1d = '\x10';
  return;
}

Assistant:

static inline void set_tpl_stats_block_size(uint8_t *block_mis_log2,
                                            uint8_t *tpl_bsize_1d) {
  // tpl stats bsize: 2 means 16x16
  *block_mis_log2 = 2;
  // Block size used in tpl motion estimation
  *tpl_bsize_1d = 16;
  // MIN_TPL_BSIZE_1D = 16;
  assert(*tpl_bsize_1d >= 16);
}